

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::section(QString *__return_storage_ptr__,QString *this,QString *sep,qsizetype start,
                qsizetype end,SectionFlags flags)

{
  QStringView sep_00;
  QStringView *pQVar1;
  qsizetype qVar2;
  undefined1 *puVar3;
  qsizetype len;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  qsizetype x;
  undefined1 *puVar8;
  qsizetype i;
  undefined1 *puVar9;
  undefined1 *puVar10;
  long in_FS_OFFSET;
  QStringView local_68;
  QArrayDataPointer<QStringView> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.m_data = (this->d).ptr;
  local_68.m_size = (this->d).size;
  sep_00.m_data = (sep->d).ptr;
  sep_00.m_size = (sep->d).size;
  QStringView::split((QList<QStringView> *)&local_58,&local_68,sep_00,(SplitBehavior)0x0,
                     (uint)(((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                                   super_QFlagsStorage<QString::SectionFlag>.i & 8) == 0));
  qVar2 = local_58.size;
  puVar6 = (undefined1 *)local_58.size;
  if (((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
             super_QFlagsStorage<QString::SectionFlag>.i & 1) != 0) {
    lVar5 = 0;
    for (lVar4 = 0; local_58.size << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      lVar5 = lVar5 + (ulong)(*(long *)((long)&(local_58.ptr)->m_size + lVar4) == 0);
    }
    puVar6 = (undefined1 *)(local_58.size + -lVar5);
  }
  (__return_storage_ptr__->d).size = 0;
  puVar3 = (undefined1 *)((start >> 0x3f & (ulong)puVar6) + start);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if ((((long)puVar3 < local_58.size) &&
      (puVar6 = (undefined1 *)((end >> 0x3f & (ulong)puVar6) + end), -1 < (long)puVar6)) &&
     ((long)puVar3 <= (long)puVar6)) {
    lVar4 = 8;
    puVar8 = (undefined1 *)0x0;
    puVar7 = puVar3;
    puVar10 = puVar6;
    for (puVar9 = (undefined1 *)0x0;
        (pQVar1 = local_58.ptr, (long)puVar8 <= (long)puVar6 && (puVar9 < (ulong)qVar2));
        puVar9 = puVar9 + 1) {
      lVar5 = *(long *)((long)&(local_58.ptr)->m_data + lVar4);
      if ((long)puVar3 <= (long)puVar8) {
        if (puVar8 == puVar6) {
          puVar10 = puVar9;
        }
        if (puVar8 == puVar3) {
          puVar7 = puVar9;
        }
        len = lVar5;
        if (puVar9 != (undefined1 *)0x0 && (long)puVar3 < (long)puVar8) {
          append(__return_storage_ptr__,sep);
          len = *(qsizetype *)((long)&pQVar1->m_data + lVar4);
        }
        append(__return_storage_ptr__,*(QChar **)((long)pQVar1 + lVar4 + -8),len);
      }
      puVar8 = puVar8 + (((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                                super_QFlagsStorage<QString::SectionFlag>.i & 1) == 0 || lVar5 != 0)
      ;
      lVar4 = lVar4 + 0x10;
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                super_QFlagsStorage<QString::SectionFlag>.i & 2) != 0) && (0 < (long)puVar7)) {
      prepend(__return_storage_ptr__,sep);
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                super_QFlagsStorage<QString::SectionFlag>.i & 4) != 0) &&
       ((long)puVar10 < (long)(qVar2 + -1))) {
      append(__return_storage_ptr__,sep);
    }
  }
  QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::section(const QString &sep, qsizetype start, qsizetype end, SectionFlags flags) const
{
    const QList<QStringView> sections = QStringView{ *this }.split(
            sep, Qt::KeepEmptyParts, (flags & SectionCaseInsensitiveSeps) ? Qt::CaseInsensitive : Qt::CaseSensitive);
    const qsizetype sectionsSize = sections.size();
    if (!(flags & SectionSkipEmpty)) {
        if (start < 0)
            start += sectionsSize;
        if (end < 0)
            end += sectionsSize;
    } else {
        qsizetype skip = 0;
        for (qsizetype k = 0; k < sectionsSize; ++k) {
            if (sections.at(k).isEmpty())
                skip++;
        }
        if (start < 0)
            start += sectionsSize - skip;
        if (end < 0)
            end += sectionsSize - skip;
    }
    if (start >= sectionsSize || end < 0 || start > end)
        return QString();

    QString ret;
    qsizetype first_i = start, last_i = end;
    for (qsizetype x = 0, i = 0; x <= end && i < sectionsSize; ++i) {
        const QStringView &section = sections.at(i);
        const bool empty = section.isEmpty();
        if (x >= start) {
            if (x == start)
                first_i = i;
            if (x == end)
                last_i = i;
            if (x > start && i > 0)
                ret += sep;
            ret += section;
        }
        if (!empty || !(flags & SectionSkipEmpty))
            x++;
    }
    if ((flags & SectionIncludeLeadingSep) && first_i > 0)
        ret.prepend(sep);
    if ((flags & SectionIncludeTrailingSep) && last_i < sectionsSize - 1)
        ret += sep;
    return ret;
}